

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O0

void Gla_ManRollBack(Gla_Man_t *p)

{
  int iVar1;
  int i_00;
  int iVar2;
  Gla_Obj_t *pGVar3;
  int iFrame;
  int iObj;
  int i;
  Gla_Man_t *p_local;
  
  for (iFrame = 0; iVar1 = Vec_IntSize(p->vAddedNew), iFrame + 1 < iVar1; iFrame = iFrame + 2) {
    iVar1 = Vec_IntEntry(p->vAddedNew,iFrame);
    i_00 = Vec_IntEntry(p->vAddedNew,iFrame + 1);
    pGVar3 = Gla_ManObj(p,iVar1);
    iVar2 = Vec_IntEntry(&pGVar3->vFrames,i_00);
    if (iVar2 < 1) {
      __assert_fail("Vec_IntEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame ) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                    ,0x582,"void Gla_ManRollBack(Gla_Man_t *)");
    }
    pGVar3 = Gla_ManObj(p,iVar1);
    Vec_IntWriteEntry(&pGVar3->vFrames,i_00,0);
  }
  iFrame = p->nAbsOld;
  while( true ) {
    iVar1 = Vec_IntSize(p->vAbs);
    if (iVar1 <= iFrame) {
      Vec_IntShrink(p->vAbs,p->nAbsOld);
      return;
    }
    iVar1 = Vec_IntEntry(p->vAbs,iFrame);
    pGVar3 = Gla_ManObj(p,iVar1);
    if ((*(uint *)&pGVar3->field_0x4 & 1) != 1) break;
    pGVar3 = Gla_ManObj(p,iVar1);
    *(uint *)&pGVar3->field_0x4 = *(uint *)&pGVar3->field_0x4 & 0xfffffffe;
    iFrame = iFrame + 1;
  }
  __assert_fail("Gla_ManObj( p, iObj )->fAbs == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                ,0x587,"void Gla_ManRollBack(Gla_Man_t *)");
}

Assistant:

void Gla_ManRollBack( Gla_Man_t * p )
{
    int i, iObj, iFrame;
    Vec_IntForEachEntryDouble( p->vAddedNew, iObj, iFrame, i )
    {
        assert( Vec_IntEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame ) > 0 );
        Vec_IntWriteEntry( &Gla_ManObj(p, iObj)->vFrames, iFrame, 0 );
    }
    Vec_IntForEachEntryStart( p->vAbs, iObj, i, p->nAbsOld )
    {
        assert( Gla_ManObj( p, iObj )->fAbs == 1 );
        Gla_ManObj( p, iObj )->fAbs = 0;
    }
    Vec_IntShrink( p->vAbs, p->nAbsOld );
}